

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streambuf.cpp
# Opt level: O1

streampos __thiscall
booster::streambuf::seekoff(streambuf *this,streamoff off,seekdir seekdir,openmode param_3)

{
  int iVar1;
  ulong uVar2;
  io_device *piVar3;
  undefined4 extraout_var;
  streampos sVar4;
  
  iVar1 = (**(code **)(*(long *)this + 0x30))();
  uVar2 = 0xffffffffffffffff;
  if (iVar1 == 0) {
    if ((this->buffer_in_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (this->buffer_in_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      *(undefined8 *)&this->field_0x8 = 0;
      *(undefined8 *)&this->field_0x10 = 0;
      *(undefined8 *)&this->field_0x18 = 0;
    }
    if (seekdir < (_S_end|_S_cur)) {
      piVar3 = device(this);
      iVar1 = (*piVar3->_vptr_io_device[2])(piVar3,off,(ulong)seekdir);
      uVar2 = CONCAT44(extraout_var,iVar1);
    }
  }
  sVar4._M_state.__count = 0;
  sVar4._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  sVar4._M_off = uVar2;
  return sVar4;
}

Assistant:

std::streampos streambuf::seekoff(	std::streamoff off,
						std::ios_base::seekdir seekdir,
						std::ios_base::openmode /*m*/)
	{
		if(sync())
			return -1;
		if(!buffer_in_.empty()) {
			setg(0,0,0);
		}
		if(seekdir == std::ios_base::cur)
			return device().seek(off,io_device::cur);
		if(seekdir == std::ios_base::beg)
			return device().seek(off,io_device::set);
		if(seekdir == std::ios_base::end)
			return device().seek(off,io_device::end);
		return -1;
	}